

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckIfWhileForUntil.cxx
# Opt level: O2

bool __thiscall kws::Parser::CheckIfWhileForUntil(Parser *this,uint after)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  char *__s;
  
  this->m_TestsDone[0x22] = true;
  std::__cxx11::string::assign((char *)(this->m_TestsDescription + 0x22));
  __s = (char *)operator_new__(200);
  snprintf(__s,200," = %d",after);
  std::__cxx11::string::append((char *)(this->m_TestsDescription + 0x22));
  operator_delete__(__s);
  bVar1 = FindIfWhileForUntil(this,"if",after);
  bVar2 = FindIfWhileForUntil(this,"while",after);
  bVar3 = FindIfWhileForUntil(this,"for",after);
  bVar4 = FindIfWhileForUntil(this,"until",after);
  return (bVar4 && bVar3) && (bVar2 && bVar1);
}

Assistant:

bool Parser::CheckIfWhileForUntil(unsigned int after)
{
  m_TestsDone[IFWHILEFORUNTIL] = true;
  m_TestsDescription[IFWHILEFORUNTIL] =
    "Number of spaces after If/While/For should be";
  constexpr size_t length = 200;
  char* val = new char[length];
  snprintf(val,length," = %d",after);
  m_TestsDescription[IFWHILEFORUNTIL] += val;
  delete [] val;

  bool hasErrors = false;
  
  if(!this->FindIfWhileForUntil("if",after))
    {
    hasErrors = true;
    }
  if(!this->FindIfWhileForUntil("while",after))
    {
    hasErrors = true;
    }
  if(!this->FindIfWhileForUntil("for",after))
    {
    hasErrors = true;
    }
  if(!this->FindIfWhileForUntil("until",after))
    {
    hasErrors = true;
    }

  return !hasErrors;
}